

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O3

int mbedtls_net_accept(mbedtls_net_context *bind_ctx,mbedtls_net_context *client_ctx,void *client_ip
                      ,size_t buf_size,size_t *ip_len)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  ushort local_150;
  char buf [1];
  undefined1 local_d0 [8];
  sockaddr_storage client_addr;
  socklen_t type_len;
  undefined4 local_3c;
  int local_38;
  int one;
  int type;
  socklen_t n;
  
  one = 0x80;
  client_addr.__ss_align._4_4_ = 4;
  iVar1 = getsockopt(bind_ctx->fd,1,3,&local_38,(socklen_t *)((long)&client_addr.__ss_align + 4));
  iVar2 = -0x4a;
  if ((iVar1 == 0) && (0xfffffffd < local_38 - 3U)) {
    if (local_38 == 1) {
      iVar2 = accept(bind_ctx->fd,(sockaddr *)local_d0,(socklen_t *)&one);
      client_ctx->fd = iVar2;
    }
    else {
      local_150 = local_150 & 0xff00;
      sVar4 = recvfrom(bind_ctx->fd,&stack0xfffffffffffffeb0,1,2,(sockaddr *)local_d0,
                       (socklen_t *)&one);
      iVar2 = (int)sVar4;
    }
    if (iVar2 < 0) {
      iVar2 = bind_ctx->fd;
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      uVar3 = fcntl(iVar2,3);
      iVar2 = -0x6900;
      if (iVar1 != 0xb) {
        iVar2 = -0x4a;
      }
      *piVar5 = iVar1;
      if ((uVar3 >> 0xb & 1) == 0) {
        iVar2 = -0x4a;
      }
    }
    else {
      if (local_38 != 1) {
        local_3c = 1;
        iVar2 = connect(bind_ctx->fd,(sockaddr *)local_d0,one);
        if (iVar2 != 0) {
          return -0x4a;
        }
        client_ctx->fd = bind_ctx->fd;
        bind_ctx->fd = -1;
        one = 0x80;
        iVar2 = getsockname(client_ctx->fd,(sockaddr *)&stack0xfffffffffffffeb0,(socklen_t *)&one);
        if (iVar2 != 0) {
          return -0x42;
        }
        iVar2 = socket((uint)local_150,2,0x11);
        bind_ctx->fd = iVar2;
        if (iVar2 < 0) {
          return -0x42;
        }
        iVar2 = setsockopt(iVar2,1,2,&local_3c,4);
        if (iVar2 != 0) {
          return -0x42;
        }
        iVar2 = bind(bind_ctx->fd,(sockaddr *)&stack0xfffffffffffffeb0,one);
        if (iVar2 != 0) {
          return -0x46;
        }
      }
      iVar2 = 0;
      if (client_ip != (void *)0x0) {
        if (local_d0._0_2_ == 2) {
          *ip_len = 4;
          if (buf_size < 4) {
            return -0x43;
          }
          *(undefined4 *)client_ip = local_d0._4_4_;
        }
        else {
          *ip_len = 0x10;
          if (buf_size < 0x10) {
            return -0x43;
          }
          *(undefined8 *)client_ip = client_addr._0_8_;
          *(undefined8 *)((long)client_ip + 8) = client_addr.__ss_padding._6_8_;
        }
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_net_accept(mbedtls_net_context *bind_ctx,
                       mbedtls_net_context *client_ctx,
                       void *client_ip, size_t buf_size, size_t *ip_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    int type;

    struct sockaddr_storage client_addr;

#if defined(__socklen_t_defined) || defined(_SOCKLEN_T) ||  \
    defined(_SOCKLEN_T_DECLARED) || defined(__DEFINED_socklen_t) || \
    defined(socklen_t) || (defined(_POSIX_VERSION) && _POSIX_VERSION >= 200112L)
    socklen_t n = (socklen_t) sizeof(client_addr);
    socklen_t type_len = (socklen_t) sizeof(type);
#else
    int n = (int) sizeof(client_addr);
    int type_len = (int) sizeof(type);
#endif

    /* Is this a TCP or UDP socket? */
    if (getsockopt(bind_ctx->fd, SOL_SOCKET, SO_TYPE,
                   (void *) &type, &type_len) != 0 ||
        (type != SOCK_STREAM && type != SOCK_DGRAM)) {
        return MBEDTLS_ERR_NET_ACCEPT_FAILED;
    }

    if (type == SOCK_STREAM) {
        /* TCP: actual accept() */
        ret = client_ctx->fd = (int) accept(bind_ctx->fd,
                                            (struct sockaddr *) &client_addr, &n);
    } else {
        /* UDP: wait for a message, but keep it in the queue */
        char buf[1] = { 0 };

        ret = (int) recvfrom(bind_ctx->fd, buf, sizeof(buf), MSG_PEEK,
                             (struct sockaddr *) &client_addr, &n);

#if defined(_WIN32)
        if (ret == SOCKET_ERROR &&
            WSAGetLastError() == WSAEMSGSIZE) {
            /* We know buf is too small, thanks, just peeking here */
            ret = 0;
        }
#endif
    }

    if (ret < 0) {
        if (net_would_block(bind_ctx) != 0) {
            return MBEDTLS_ERR_SSL_WANT_READ;
        }

        return MBEDTLS_ERR_NET_ACCEPT_FAILED;
    }

    /* UDP: hijack the listening socket to communicate with the client,
     * then bind a new socket to accept new connections */
    if (type != SOCK_STREAM) {
        struct sockaddr_storage local_addr;
        int one = 1;

        if (connect(bind_ctx->fd, (struct sockaddr *) &client_addr, n) != 0) {
            return MBEDTLS_ERR_NET_ACCEPT_FAILED;
        }

        client_ctx->fd = bind_ctx->fd;
        bind_ctx->fd   = -1; /* In case we exit early */

        n = sizeof(struct sockaddr_storage);
        if (getsockname(client_ctx->fd,
                        (struct sockaddr *) &local_addr, &n) != 0 ||
            (bind_ctx->fd = (int) socket(local_addr.ss_family,
                                         SOCK_DGRAM, IPPROTO_UDP)) < 0 ||
            setsockopt(bind_ctx->fd, SOL_SOCKET, SO_REUSEADDR,
                       (const char *) &one, sizeof(one)) != 0) {
            return MBEDTLS_ERR_NET_SOCKET_FAILED;
        }

        if (bind(bind_ctx->fd, (struct sockaddr *) &local_addr, n) != 0) {
            return MBEDTLS_ERR_NET_BIND_FAILED;
        }
    }

    if (client_ip != NULL) {
        if (client_addr.ss_family == AF_INET) {
            struct sockaddr_in *addr4 = (struct sockaddr_in *) &client_addr;
            *ip_len = sizeof(addr4->sin_addr.s_addr);

            if (buf_size < *ip_len) {
                return MBEDTLS_ERR_NET_BUFFER_TOO_SMALL;
            }

            memcpy(client_ip, &addr4->sin_addr.s_addr, *ip_len);
        } else {
            struct sockaddr_in6 *addr6 = (struct sockaddr_in6 *) &client_addr;
            *ip_len = sizeof(addr6->sin6_addr.s6_addr);

            if (buf_size < *ip_len) {
                return MBEDTLS_ERR_NET_BUFFER_TOO_SMALL;
            }

            memcpy(client_ip, &addr6->sin6_addr.s6_addr, *ip_len);
        }
    }

    return 0;
}